

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall flatbuffers::Parser::SkipByteOrderMark(Parser *this)

{
  char *pcVar1;
  string *in_RSI;
  long *local_38 [2];
  long local_28 [2];
  
  pcVar1 = (char *)in_RSI->_M_string_length;
  if (*pcVar1 == -0x11) {
    in_RSI->_M_string_length = (size_type)(pcVar1 + 1);
    if (pcVar1[1] == -0x45) {
      in_RSI->_M_string_length = (size_type)(pcVar1 + 2);
      if (pcVar1[2] == -0x41) {
        in_RSI->_M_string_length = (size_type)(pcVar1 + 3);
        goto LAB_001160e6;
      }
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_38,"invalid utf-8 byte order mark","");
      Error(this,in_RSI);
    }
    else {
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_38,"invalid utf-8 byte order mark","");
      Error(this,in_RSI);
    }
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  else {
LAB_001160e6:
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::SkipByteOrderMark() {
  if (static_cast<unsigned char>(*cursor_) != 0xef) return NoError();
  cursor_++;
  if (static_cast<unsigned char>(*cursor_) != 0xbb)
    return Error("invalid utf-8 byte order mark");
  cursor_++;
  if (static_cast<unsigned char>(*cursor_) != 0xbf)
    return Error("invalid utf-8 byte order mark");
  cursor_++;
  return NoError();
}